

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

int32_t argv2int(jit_State *J,TValue *o)

{
  int iVar1;
  double *in_RSI;
  undefined4 in_stack_ffffffffffffffd8;
  TraceError in_stack_ffffffffffffffdc;
  uint6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  bool bVar2;
  
  bVar2 = true;
  if ((0xfffeffff < *(uint *)((long)in_RSI + 4)) &&
     (in_stack_ffffffffffffffe6 = false, bVar2 = (bool)in_stack_ffffffffffffffe6,
     *(int *)((long)in_RSI + 4) == -5)) {
    iVar1 = lj_strscan_num((GCstr *)CONCAT17(1,(uint7)in_stack_ffffffffffffffe0),
                           (TValue *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    in_stack_ffffffffffffffe6 = iVar1 != 0;
    bVar2 = (bool)in_stack_ffffffffffffffe6;
  }
  if (bVar2 != false) {
    return (int)*in_RSI;
  }
  lj_trace_err((jit_State *)(ulong)CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
}

Assistant:

static int32_t argv2int(jit_State *J, TValue *o)
{
  if (!lj_strscan_numberobj(o))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  return tvisint(o) ? intV(o) : lj_num2int(numV(o));
}